

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_> __thiscall
perfetto::base::UnixSocket::Listen
          (UnixSocket *this,string *socket_name,EventListener *event_listener,
          TaskRunner *task_runner,SockFamily sock_family,SockType sock_type)

{
  bool bVar1;
  UnixSocketRaw local_54;
  undefined1 local_40 [8];
  UnixSocketRaw sock_raw;
  SockType sock_type_local;
  SockFamily sock_family_local;
  TaskRunner *task_runner_local;
  EventListener *event_listener_local;
  string *socket_name_local;
  
  sock_raw.type_ = sock_type;
  sock_raw.tx_timeout_ms_ = sock_family;
  UnixSocketRaw::CreateMayFail((UnixSocketRaw *)local_40,sock_family,sock_type);
  bVar1 = UnixSocketRaw::operator_cast_to_bool((UnixSocketRaw *)local_40);
  if ((bVar1) && (bVar1 = UnixSocketRaw::Bind((UnixSocketRaw *)local_40,socket_name), bVar1)) {
    UnixSocketRaw::ReleaseFd(&local_54);
    Listen(this,&local_54.fd_,event_listener,task_runner,sock_raw.tx_timeout_ms_,sock_raw.type_);
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_54.fd_);
  }
  else {
    ::std::unique_ptr<perfetto::base::UnixSocket,std::default_delete<perfetto::base::UnixSocket>>::
    unique_ptr<std::default_delete<perfetto::base::UnixSocket>,void>
              ((unique_ptr<perfetto::base::UnixSocket,std::default_delete<perfetto::base::UnixSocket>>
                *)this,(nullptr_t)0x0);
  }
  local_54.family_ = 1;
  UnixSocketRaw::~UnixSocketRaw((UnixSocketRaw *)local_40);
  return (__uniq_ptr_data<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>,_true,_true>
          )(__uniq_ptr_data<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<UnixSocket> UnixSocket::Listen(const std::string& socket_name,
                                               EventListener* event_listener,
                                               TaskRunner* task_runner,
                                               SockFamily sock_family,
                                               SockType sock_type) {
  auto sock_raw = UnixSocketRaw::CreateMayFail(sock_family, sock_type);
  if (!sock_raw || !sock_raw.Bind(socket_name))
    return nullptr;

  // Forward the call to the Listen() overload below.
  return Listen(sock_raw.ReleaseFd(), event_listener, task_runner, sock_family,
                sock_type);
}